

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.cpp
# Opt level: O2

void __thiscall zmq::fq_t::pipe_terminated(fq_t *this,pipe_t *pipe_)

{
  size_type index2_;
  size_type index1_;
  
  index1_ = (size_type)(pipe_->super_array_item_t<1>)._array_index;
  if (index1_ < this->_active) {
    index2_ = this->_active - 1;
    this->_active = index2_;
    array_t<zmq::pipe_t,_1>::swap(&this->_pipes,index1_,index2_);
    if (this->_current == this->_active) {
      this->_current = 0;
    }
  }
  array_t<zmq::pipe_t,_1>::erase(&this->_pipes,pipe_);
  if (this->_last_in == pipe_) {
    this->_last_in = (pipe_t *)0x0;
  }
  return;
}

Assistant:

void zmq::fq_t::pipe_terminated (pipe_t *pipe_)
{
    const pipes_t::size_type index = _pipes.index (pipe_);

    //  Remove the pipe from the list; adjust number of active pipes
    //  accordingly.
    if (index < _active) {
        _active--;
        _pipes.swap (index, _active);
        if (_current == _active)
            _current = 0;
    }
    _pipes.erase (pipe_);

    if (_last_in == pipe_) {
        _last_in = NULL;
    }
}